

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImTriangulator::Init(ImTriangulator *this,ImVec2 *points,int points_count,void *scratch_buffer)

{
  int iVar1;
  ImTriangulatorNode *in_RCX;
  int in_EDX;
  ImTriangulator *in_RSI;
  ImTriangulator *in_RDI;
  
  iVar1 = EstimateTriangleCount(in_EDX);
  in_RDI->_TrianglesLeft = iVar1;
  in_RDI->_Nodes = in_RCX;
  (in_RDI->_Ears).Data = (ImTriangulatorNode **)(in_RDI->_Nodes + in_EDX);
  (in_RDI->_Reflexes).Data =
       (ImTriangulatorNode **)(&in_RDI->_Nodes[in_EDX].Type + (long)in_EDX * 2);
  BuildNodes(in_RDI,(ImVec2 *)in_RSI,in_EDX);
  BuildReflexes(in_RSI);
  BuildEars(in_RSI);
  return;
}

Assistant:

void ImTriangulator::Init(const ImVec2* points, int points_count, void* scratch_buffer)
{
    IM_ASSERT(scratch_buffer != NULL && points_count >= 3);
    _TrianglesLeft = EstimateTriangleCount(points_count);
    _Nodes         = (ImTriangulatorNode*)scratch_buffer;                          // points_count x Node
    _Ears.Data     = (ImTriangulatorNode**)(_Nodes + points_count);                // points_count x Node*
    _Reflexes.Data = (ImTriangulatorNode**)(_Nodes + points_count) + points_count; // points_count x Node*
    BuildNodes(points, points_count);
    BuildReflexes();
    BuildEars();
}